

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O0

int32_t ultag_getVariantsSize(ULanguageTag *langtag)

{
  VariantListEntry *local_20;
  VariantListEntry *cur;
  int32_t size;
  ULanguageTag *langtag_local;
  
  cur._4_4_ = 0;
  for (local_20 = langtag->variants; local_20 != (VariantListEntry *)0x0; local_20 = local_20->next)
  {
    cur._4_4_ = cur._4_4_ + 1;
  }
  return cur._4_4_;
}

Assistant:

static int32_t
ultag_getVariantsSize(const ULanguageTag* langtag) {
    int32_t size = 0;
    VariantListEntry *cur = langtag->variants;
    while (TRUE) {
        if (cur == NULL) {
            break;
        }
        size++;
        cur = cur->next;
    }
    return size;
}